

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9MemObjStringAppend(jx9_value *pObj,char *zData,sxu32 nLen)

{
  sxi32 sVar1;
  
  if ((pObj->iFlags & 1) == 0) {
    jx9MemObjRelease(pObj);
    pObj->iFlags = (pObj->iFlags & 0xfffffe90U) + 1;
  }
  sVar1 = SyBlobAppend(&pObj->sBlob,zData,nLen);
  return sVar1;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjStringAppend(jx9_value *pObj, const char *zData, sxu32 nLen)
{
	sxi32 rc;
	if( (pObj->iFlags & MEMOBJ_STRING) == 0 ){
		/* Invalidate any prior representation */
		jx9MemObjRelease(pObj);
		MemObjSetType(pObj, MEMOBJ_STRING);
	}
	/* Append contents */
	rc = SyBlobAppend(&pObj->sBlob, zData, nLen);
	return rc;
}